

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O2

int Llb_Nonlin4HasSingletonVars(Llb_Mgr_t_conflict *p,Llb_Prt_t *pPart)

{
  int iVar1;
  int i;
  
  i = 0;
  do {
    if (pPart->vVars->nSize <= i) {
      return 0;
    }
    iVar1 = Vec_IntEntry(pPart->vVars,i);
    i = i + 1;
  } while (p->pVars[iVar1]->vParts->nSize != 1);
  return 1;
}

Assistant:

int Llb_Nonlin4HasSingletonVars( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    Llb_Var_t * pVar;
    int i;
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( Vec_IntSize(pVar->vParts) == 1 )
            return 1;
    return 0;
}